

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O0

int SZ_BufftoBuffDecompress
              (void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong *in_RSI;
  void *in_RDI;
  long in_R8;
  size_t padding_size;
  size_t buf_size;
  int pixel_size;
  int extra_buffer;
  int deinterleave;
  int pad_scanline;
  void *buf;
  size_t scanlines;
  size_t total_out;
  int status;
  aec_stream strm;
  int in_stack_00000144;
  aec_stream_conflict *in_stack_ffffffffffffff38;
  bool local_b2;
  bool local_b1;
  ulong in_stack_ffffffffffffff58;
  void *buf_00;
  ulong local_88;
  ulong local_80;
  int local_74;
  ulong local_48;
  int local_40;
  
  iVar1 = *(int *)(in_R8 + 8);
  iVar2 = *(int *)(in_R8 + 0xc);
  iVar3 = *(int *)(in_R8 + 8);
  iVar4 = *(int *)(in_R8 + 8);
  convert_options(in_stack_00000144);
  buf_00 = (void *)0x0;
  iVar8 = *(int *)(in_R8 + 0xc) % *(int *)(in_R8 + 8);
  local_b1 = true;
  if (*(int *)(in_R8 + 4) != 0x20) {
    local_b1 = *(int *)(in_R8 + 4) == 0x40;
  }
  uVar5 = (uint)local_b1;
  local_b2 = iVar8 != 0 || uVar5 != 0;
  uVar6 = (uint)local_b2;
  if (uVar5 == 0) {
    local_40 = *(int *)(in_R8 + 4);
  }
  else {
    local_40 = 8;
  }
  iVar7 = bits_to_bytes(local_40);
  if (uVar6 != 0) {
    if (iVar8 == 0) {
      in_stack_ffffffffffffff58 = *in_RSI;
    }
    else {
      local_88 = ((*in_RSI / (ulong)(long)iVar7 + (long)*(int *)(in_R8 + 0xc)) - 1) /
                 (ulong)(long)*(int *)(in_R8 + 0xc);
      in_stack_ffffffffffffff58 = (uint)(((iVar2 + iVar3 + -1) / iVar4) * iVar1 * iVar7) * local_88;
    }
    buf_00 = malloc(in_stack_ffffffffffffff58);
    if (buf_00 == (void *)0x0) {
      local_74 = -4;
      goto LAB_002e4052;
    }
  }
  local_74 = aec_buffer_decode(in_stack_ffffffffffffff38);
  if (local_74 == 0) {
    if (iVar8 == 0) {
      local_80 = local_48;
    }
    else {
      remove_padding(buf_00,CONCAT44(iVar8,uVar5),CONCAT44(uVar6,iVar7),in_stack_ffffffffffffff58,0)
      ;
      local_80 = local_88 * (long)*(int *)(in_R8 + 0xc) * (long)iVar7;
    }
    if (local_80 < *in_RSI) {
      *in_RSI = local_80;
    }
    if (uVar5 == 0) {
      if (iVar8 != 0) {
        memcpy(in_RDI,buf_00,*in_RSI);
      }
    }
    else {
      deinterleave_buffer(in_RDI,buf_00,*in_RSI,*(int *)(in_R8 + 4) / 8);
    }
  }
LAB_002e4052:
  if ((uVar6 != 0) && (buf_00 != (void *)0x0)) {
    free(buf_00);
  }
  return local_74;
}

Assistant:

int SZ_BufftoBuffDecompress(void *dest, size_t *destLen,
                            const void *source, size_t sourceLen,
                            SZ_com_t *param)
{
    struct aec_stream strm;
    int status;
    size_t total_out;
    size_t scanlines;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = convert_options(param->options_mask);
    strm.avail_in = sourceLen;
    strm.next_in = source;
    void *buf = 0;

    int pad_scanline = param->pixels_per_scanline % param->pixels_per_block;
    int deinterleave = (param->bits_per_pixel == 32
                        || param->bits_per_pixel == 64);
    int extra_buffer = pad_scanline || deinterleave;
    int pixel_size;

    if (deinterleave)
        strm.bits_per_sample = 8;
    else
        strm.bits_per_sample = param->bits_per_pixel;
    pixel_size = bits_to_bytes(strm.bits_per_sample);


    if (extra_buffer) {
        size_t buf_size;
        if (pad_scanline) {
            scanlines = (*destLen / pixel_size + param->pixels_per_scanline - 1)
                / param->pixels_per_scanline;
            buf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
        } else {
            buf_size = *destLen;
        }
        buf = malloc(buf_size);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        strm.next_out = buf;
        strm.avail_out = buf_size;
    } else {
        strm.next_out = dest;
        strm.avail_out = *destLen;
    }

    status = aec_buffer_decode(&strm);
    if (status != AEC_OK)
        goto CLEANUP;

    if (pad_scanline) {
        size_t padding_size =
            (strm.rsi * strm.block_size - param->pixels_per_scanline)
            * pixel_size;
        remove_padding(buf, strm.total_out,
                       param->pixels_per_scanline * pixel_size,
                       padding_size, pixel_size);
        total_out = scanlines * param->pixels_per_scanline * pixel_size;
    } else {
        total_out = strm.total_out;
    }

    if (total_out < *destLen)
        *destLen = total_out;

    if (deinterleave)
        deinterleave_buffer(dest, buf, *destLen, param->bits_per_pixel / 8);
    else if (pad_scanline)
        memcpy(dest, buf, *destLen);

CLEANUP:
    if (extra_buffer && buf)
        free(buf);

    return status;
}